

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
                    *handler)

{
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *pfVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  char *message;
  error_handler *this;
  uint uVar5;
  
  wVar3 = *begin;
  if ((wVar3 == L'}') || (wVar3 == L':')) {
    pfVar1 = handler->handler;
    this = (error_handler *)&pfVar1->context_;
    uVar5 = (pfVar1->context_).next_arg_id_;
    if ((int)uVar5 < 0) {
      error_handler::on_error(this,"cannot switch from manual to automatic argument indexing");
      pfVar1->arg_id_ = 0;
      return begin;
    }
    (pfVar1->context_).next_arg_id_ = uVar5 + 1;
    pfVar1->arg_id_ = uVar5;
    if (uVar5 < 2) {
      return begin;
    }
    message = "argument index out of range";
  }
  else {
    if ((uint)(wVar3 + L'\xffffffd0') < 10) {
      begin = begin + 1;
      uVar5 = 0;
      pwVar2 = begin;
      if (wVar3 != L'0') {
        do {
          begin = pwVar2;
          if (0xccccccc < uVar5) {
            begin = begin + -1;
            uVar5 = 0x80000000;
            goto LAB_001cf4d3;
          }
          uVar5 = (wVar3 + uVar5 * 10) - 0x30;
          if (begin == end) break;
          wVar3 = *begin;
          pwVar2 = begin + 1;
        } while ((uint)(wVar3 + L'\xffffffd0') < 10);
        if ((int)uVar5 < 0) {
LAB_001cf4d3:
          error_handler::on_error((error_handler *)&handler->handler->context_,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == L':' || (*begin == L'}')))) {
        pfVar1 = handler->handler;
        pfVar1->arg_id_ = uVar5;
        this = (error_handler *)&pfVar1->context_;
        if ((pfVar1->context_).next_arg_id_ < 1) {
          (pfVar1->context_).next_arg_id_ = -1;
        }
        else {
          error_handler::on_error(this,"cannot switch from automatic to manual argument indexing");
          uVar5 = pfVar1->arg_id_;
        }
        if (uVar5 < 2) {
          return begin;
        }
        message = "argument index out of range";
        goto LAB_001cf52a;
      }
    }
    else if ((wVar3 == L'_') || ((uint)((wVar3 & 0xffffffdfU) - 0x41U) < 0x1a)) {
      pwVar2 = begin + 1;
      do {
        pwVar4 = pwVar2;
        if (pwVar4 == end) {
          return pwVar4;
        }
        wVar3 = *pwVar4;
        pwVar2 = pwVar4 + 1;
      } while ((((uint)(wVar3 + L'\xffffffd0') < 10) || (wVar3 == L'_')) ||
              ((uint)((wVar3 & 0xffffffdfU) - 0x41U) < 0x1a));
      return pwVar4;
    }
    this = (error_handler *)&handler->handler->context_;
    message = "invalid format string";
  }
LAB_001cf52a:
  error_handler::on_error(this,message);
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}